

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O2

void duckdb::DatePartCachedFunction<duckdb::DatePart::YearOperator,duckdb::timestamp_t>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  UnifiedVectorFormat *count;
  int64_t *piVar1;
  int64_t *piVar2;
  unsigned_long *puVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  optional_ptr<duckdb::FunctionLocalState,_true> oVar7;
  FunctionLocalState *pFVar8;
  reference vector;
  UnifiedVectorFormat *pUVar9;
  int64_t iVar10;
  UnifiedVectorFormat *idx;
  ulong uVar11;
  VectorType VVar12;
  idx_t i;
  UnifiedVectorFormat *pUVar13;
  ulong uVar14;
  TemplatedValidityMask<unsigned_long> *pTVar15;
  optional_ptr<duckdb::FunctionLocalState,_true> local_78;
  long local_70;
  long local_68;
  
  local_78.ptr = *(FunctionLocalState **)(state + 0xb0);
  pFVar8 = optional_ptr<duckdb::FunctionLocalState,_true>::operator->(&local_78);
  vector = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)args,0);
  count = *(UnifiedVectorFormat **)(args + 0x18);
  VVar12 = (VectorType)result;
  if (*vector == (value_type)0x0) {
    duckdb::Vector::SetVectorType(VVar12);
    lVar5 = *(long *)(result + 0x20);
    lVar6 = *(long *)(vector + 0x20);
    FlatVector::VerifyFlatVector(vector);
    FlatVector::VerifyFlatVector(result);
    pTVar15 = (TemplatedValidityMask<unsigned_long> *)(result + 0x28);
    if (*(long *)(vector + 0x28) == 0) {
      for (pUVar13 = (UnifiedVectorFormat *)0x0; count != pUVar13; pUVar13 = pUVar13 + 1) {
        iVar10 = DateLookupCache<duckdb::DatePart::YearOperator>::ExtractElement
                           ((DateLookupCache<duckdb::DatePart::YearOperator> *)(pFVar8 + 8),
                            (timestamp_t)*(int64_t *)(lVar6 + (long)pUVar13 * 8),
                            (ValidityMask *)pTVar15,(idx_t)pUVar13);
        *(int64_t *)(lVar5 + (long)pUVar13 * 8) = iVar10;
      }
    }
    else {
      TemplatedValidityMask<unsigned_long>::Copy
                (pTVar15,(TemplatedValidityMask<unsigned_long> *)(vector + 0x28),(idx_t)count);
      pUVar13 = (UnifiedVectorFormat *)0x0;
      for (uVar11 = 0; uVar11 != (ulong)(count + 0x3f) >> 6; uVar11 = uVar11 + 1) {
        puVar3 = ((TemplatedValidityMask<unsigned_long> *)(vector + 0x28))->validity_mask;
        if (puVar3 == (unsigned_long *)0x0) {
          pUVar9 = pUVar13 + 0x40;
          if (count <= pUVar13 + 0x40) {
            pUVar9 = count;
          }
LAB_00697dd2:
          for (; idx = pUVar13, pUVar13 < pUVar9; pUVar13 = pUVar13 + 1) {
            iVar10 = DateLookupCache<duckdb::DatePart::YearOperator>::ExtractElement
                               ((DateLookupCache<duckdb::DatePart::YearOperator> *)(pFVar8 + 8),
                                (timestamp_t)*(int64_t *)(lVar6 + (long)pUVar13 * 8),
                                (ValidityMask *)pTVar15,(idx_t)pUVar13);
            *(int64_t *)(lVar5 + (long)pUVar13 * 8) = iVar10;
          }
        }
        else {
          uVar4 = puVar3[uVar11];
          pUVar9 = pUVar13 + 0x40;
          if (count <= pUVar13 + 0x40) {
            pUVar9 = count;
          }
          if (uVar4 == 0xffffffffffffffff) goto LAB_00697dd2;
          idx = pUVar9;
          if (uVar4 != 0) {
            for (uVar14 = 0; idx = pUVar13 + uVar14, idx < pUVar9; uVar14 = uVar14 + 1) {
              if ((uVar4 >> (uVar14 & 0x3f) & 1) != 0) {
                iVar10 = DateLookupCache<duckdb::DatePart::YearOperator>::ExtractElement
                                   ((DateLookupCache<duckdb::DatePart::YearOperator> *)(pFVar8 + 8),
                                    (timestamp_t)
                                    *(int64_t *)(lVar6 + (long)pUVar13 * 8 + uVar14 * 8),
                                    (ValidityMask *)pTVar15,(idx_t)idx);
                *(int64_t *)((long)pUVar13 * 8 + lVar5 + uVar14 * 8) = iVar10;
              }
            }
          }
        }
        pUVar13 = idx;
      }
    }
  }
  else if (*vector == (value_type)0x2) {
    duckdb::Vector::SetVectorType(VVar12);
    piVar1 = *(int64_t **)(result + 0x20);
    piVar2 = *(int64_t **)(vector + 0x20);
    if ((*(byte **)(vector + 0x28) == (byte *)0x0) || ((**(byte **)(vector + 0x28) & 1) != 0)) {
      duckdb::ConstantVector::SetNull(result,false);
      iVar10 = DateLookupCache<duckdb::DatePart::YearOperator>::ExtractElement
                         ((DateLookupCache<duckdb::DatePart::YearOperator> *)(pFVar8 + 8),
                          (timestamp_t)*piVar2,(ValidityMask *)(result + 0x28),0);
      *piVar1 = iVar10;
    }
    else {
      duckdb::ConstantVector::SetNull(result,true);
    }
  }
  else {
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_78);
    duckdb::Vector::ToUnifiedFormat((ulong)vector,count);
    duckdb::Vector::SetVectorType(VVar12);
    oVar7.ptr = local_78.ptr;
    lVar5 = *(long *)(result + 0x20);
    FlatVector::VerifyFlatVector(result);
    pTVar15 = (TemplatedValidityMask<unsigned_long> *)(result + 0x28);
    if (local_68 == 0) {
      for (pUVar13 = (UnifiedVectorFormat *)0x0; count != pUVar13; pUVar13 = pUVar13 + 1) {
        lVar6 = *(long *)oVar7.ptr;
        pUVar9 = pUVar13;
        if (lVar6 != 0) {
          pUVar9 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar6 + (long)pUVar13 * 4);
        }
        iVar10 = DateLookupCache<duckdb::DatePart::YearOperator>::ExtractElement
                           ((DateLookupCache<duckdb::DatePart::YearOperator> *)(pFVar8 + 8),
                            (timestamp_t)*(int64_t *)(local_70 + (long)pUVar9 * 8),
                            (ValidityMask *)pTVar15,(idx_t)pUVar13);
        *(int64_t *)(lVar5 + (long)pUVar13 * 8) = iVar10;
      }
    }
    else {
      for (pUVar13 = (UnifiedVectorFormat *)0x0; count != pUVar13; pUVar13 = pUVar13 + 1) {
        lVar6 = *(long *)oVar7.ptr;
        pUVar9 = pUVar13;
        if (lVar6 != 0) {
          pUVar9 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar6 + (long)pUVar13 * 4);
        }
        if ((*(ulong *)(local_68 + ((ulong)pUVar9 >> 6) * 8) >> ((ulong)pUVar9 & 0x3f) & 1) == 0) {
          TemplatedValidityMask<unsigned_long>::SetInvalid(pTVar15,(idx_t)pUVar13);
        }
        else {
          iVar10 = DateLookupCache<duckdb::DatePart::YearOperator>::ExtractElement
                             ((DateLookupCache<duckdb::DatePart::YearOperator> *)(pFVar8 + 8),
                              (timestamp_t)*(int64_t *)(local_70 + (long)pUVar9 * 8),
                              (ValidityMask *)pTVar15,(idx_t)pUVar13);
          *(int64_t *)(lVar5 + (long)pUVar13 * 8) = iVar10;
        }
      }
    }
    UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)&local_78);
  }
  return;
}

Assistant:

static void DatePartCachedFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	auto &lstate = ExecuteFunctionState::GetFunctionState(state)->Cast<DateCacheLocalState<OP>>();
	UnaryExecutor::ExecuteWithNulls<T, int64_t>(
	    args.data[0], result, args.size(),
	    [&](T input, ValidityMask &mask, idx_t idx) { return lstate.cache.ExtractElement(input, mask, idx); });
}